

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

iterator __thiscall Map::DelItem(Map *this,iterator it,Character *from)

{
  Character *this_00;
  bool bVar1;
  iterator iVar2;
  _List_node_base *p_Var3;
  PacketBuilder builder;
  
  PacketBuilder::PacketBuilder(&builder,PACKET_ITEM,PACKET_REMOVE,2);
  PacketBuilder::AddShort(&builder,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
  p_Var3 = (_List_node_base *)&this->characters;
  while (p_Var3 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&this->characters) {
    this_00 = (Character *)p_Var3[1]._M_next;
    if ((from == (Character *)0x0) || (this_00 != from)) {
      bVar1 = Character::InRange(this_00,(Map_Item *)it._M_node[1]._M_next);
      if (bVar1) {
        Character::Send(this_00,&builder);
      }
    }
  }
  iVar2 = std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
          ::erase(&this->items,it._M_node);
  PacketBuilder::~PacketBuilder(&builder);
  return (iterator)iVar2._M_node;
}

Assistant:

std::list<std::shared_ptr<Map_Item>>::iterator Map::DelItem(std::list<std::shared_ptr<Map_Item>>::iterator it, Character *from)
{
	PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
	builder.AddShort((*it)->uid);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(**it))
		{
			continue;
		}

		character->Send(builder);
	}

	return this->items.erase(it);
}